

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen-cave.c
# Opt level: O0

void join_regions(chunk_conflict *c,int *colors,int *counts,_Bool allow_vault_disconnect)

{
  wchar_t size_00;
  wchar_t color_00;
  wchar_t local_34;
  wchar_t color;
  wchar_t num;
  wchar_t size;
  wchar_t w;
  wchar_t h;
  _Bool allow_vault_disconnect_local;
  int *counts_local;
  int *colors_local;
  chunk_conflict *c_local;
  
  size_00 = c->height * c->width;
  for (local_34 = count_colors(counts,size_00); L'\x01' < local_34;
      local_34 = local_34 + L'\xffffffff') {
    color_00 = first_color(counts,size_00);
    join_region(c,colors,counts,color_00,L'\xffffffff',allow_vault_disconnect);
  }
  return;
}

Assistant:

static void join_regions(struct chunk *c, int colors[], int counts[],
		bool allow_vault_disconnect) {
	int h = c->height;
	int w = c->width;
	int size = h * w;
	int num = count_colors(counts, size);

	/* While we have multiple colors (i.e. disconnected regions), join one
	 * of the regions to another one.
	 */
	while (num > 1) {
		int color = first_color(counts, size);
		join_region(c, colors, counts, color, -1,
			allow_vault_disconnect);
		num--;
	}
}